

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfCsvParser.c
# Opt level: O0

sbfError sbfCsvParser_next(FILE *f,char ***fields,u_int *nfields,u_char separator,u_int *line)

{
  char *pcVar1;
  byte bVar2;
  sbfError sVar3;
  int iVar4;
  int *piVar5;
  byte in_CL;
  undefined4 *in_RDX;
  long lVar6;
  undefined8 *in_RSI;
  FILE *in_RDI;
  int *in_R8;
  bool bVar7;
  bool bVar8;
  int saved_errno;
  int comma;
  int done;
  int quoted;
  size_t nextlen;
  char *next;
  u_char c;
  size_t off;
  size_t len;
  char *buf;
  undefined4 in_stack_ffffffffffffff68;
  u_int in_stack_ffffffffffffff6c;
  undefined5 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  size_t *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8d;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  long local_60;
  long local_48;
  long local_40;
  char *local_38;
  
  do {
    local_38 = fgetln((FILE *)CONCAT17(in_stack_ffffffffffffff8f,
                                       CONCAT16(in_stack_ffffffffffffff8e,
                                                CONCAT15(in_stack_ffffffffffffff8d,
                                                         CONCAT14(in_stack_ffffffffffffff8c,
                                                                  in_stack_ffffffffffffff88)))),
                      in_stack_ffffffffffffff80);
    if (local_38 == (char *)0x0) {
      piVar5 = __errno_location();
      sVar3 = *piVar5;
      iVar4 = feof(in_RDI);
      if (iVar4 != 0) {
        return 2;
      }
      return sVar3;
    }
    if (in_R8 != (int *)0x0) {
      *in_R8 = *in_R8 + 1;
    }
    while( true ) {
      bVar7 = false;
      if ((local_40 != 0) &&
         (in_stack_ffffffffffffff8e = true, bVar7 = (bool)in_stack_ffffffffffffff8e,
         *local_38 != ' ')) {
        in_stack_ffffffffffffff8e = *local_38 == '\t';
        bVar7 = (bool)in_stack_ffffffffffffff8e;
      }
      if (bVar7 == false) break;
      local_38 = local_38 + 1;
      local_40 = local_40 + -1;
    }
    if ((local_40 != 0) && (local_38[local_40 + -1] == '\n')) {
      local_40 = local_40 + -1;
    }
    in_stack_ffffffffffffff8f = 0;
  } while (local_40 == 0);
  *in_RSI = 0;
  *in_RDX = 0;
  local_48 = 0;
LAB_001055ba:
  local_60 = 0;
  while( true ) {
    bVar7 = false;
    if ((local_48 != local_40) && (bVar7 = true, local_38[local_48] != ' ')) {
      bVar7 = local_38[local_48] == '\t';
    }
    if (!bVar7) break;
    local_48 = local_48 + 1;
  }
  if (local_48 == local_40) {
    sbfMemory_strdup((char *)CONCAT17(in_stack_ffffffffffffff77,
                                      CONCAT16(in_stack_ffffffffffffff76,
                                               CONCAT15(in_stack_ffffffffffffff75,
                                                        in_stack_ffffffffffffff70))));
    sbfCsvParserAdd((char ***)
                    CONCAT17(in_stack_ffffffffffffff77,
                             CONCAT16(in_stack_ffffffffffffff76,
                                      CONCAT15(in_stack_ffffffffffffff75,in_stack_ffffffffffffff70))
                            ),(u_int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                    ,(char *)0x105672);
    return 0;
  }
  bVar7 = local_38[local_48] == '\"';
  if (bVar7) {
    local_48 = local_48 + 1;
  }
  bVar8 = false;
  while (lVar6 = local_48, local_48 != local_40) {
    lVar6 = local_48 + 1;
    bVar2 = local_38[local_48];
    if ((!bVar7) && (bVar2 == in_CL)) goto LAB_001056fd;
    if ((bVar7) && (bVar2 == 0x22)) {
      if (lVar6 == local_40) break;
      if (local_38[lVar6] != '\"') goto LAB_00105791;
      lVar6 = local_48 + 2;
    }
    local_48 = lVar6;
    sbfCsvParserExpand((char **)CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           in_stack_ffffffffffffff70))),
                       (size_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       0x105864);
    bRamffffffffffffffff = bVar2;
  }
  goto LAB_0010587e;
LAB_001056fd:
  while( true ) {
    bVar7 = false;
    if (local_60 != 0) {
      bVar7 = *(char *)(local_60 + -1) == ' ';
    }
    if (!bVar7) break;
    local_60 = local_60 + -1;
  }
  bVar8 = true;
  in_stack_ffffffffffffff77 = 0;
  goto LAB_0010587e;
LAB_00105791:
  while( true ) {
    local_48 = lVar6;
    bVar7 = false;
    if ((local_48 != local_40) &&
       (in_stack_ffffffffffffff75 = true, bVar7 = (bool)in_stack_ffffffffffffff75,
       local_38[local_48] != ' ')) {
      in_stack_ffffffffffffff75 = local_38[local_48] == '\t';
      bVar7 = (bool)in_stack_ffffffffffffff75;
    }
    if (bVar7 == false) break;
    lVar6 = local_48 + 1;
  }
  if ((local_48 != local_40) &&
     (pcVar1 = local_38 + local_48, local_48 = local_48 + 1, (int)*pcVar1 != (uint)in_CL)) {
    sbfCsvParser_free((char **)CONCAT17(in_stack_ffffffffffffff77,
                                        (uint7)CONCAT15(in_stack_ffffffffffffff75,
                                                        in_stack_ffffffffffffff70)),
                      in_stack_ffffffffffffff6c);
    return 0x16;
  }
  bVar8 = local_48 != local_40;
  in_stack_ffffffffffffff76 = 0;
  lVar6 = local_48;
LAB_0010587e:
  local_48 = lVar6;
  sbfCsvParserExpand((char **)CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         in_stack_ffffffffffffff70))),
                     (size_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     0x105892);
  *(undefined1 *)(local_60 + -1) = 0;
  sbfCsvParserAdd((char ***)
                  CONCAT17(in_stack_ffffffffffffff77,
                           CONCAT16(in_stack_ffffffffffffff76,
                                    CONCAT15(in_stack_ffffffffffffff75,in_stack_ffffffffffffff70))),
                  (u_int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                  (char *)0x1058bb);
  if (!bVar8) {
    return 0;
  }
  goto LAB_001055ba;
}

Assistant:

sbfError
sbfCsvParser_next (FILE* f,
                   char*** fields,
                   u_int* nfields,
                   u_char separator,
                   u_int* line)
{
    char*  buf;
    size_t len;
    size_t off;
    u_char c;
    char*  next;
    size_t nextlen;
    int    quoted;
    int    done;
    int    comma;
    int    saved_errno;

    do
    {
        buf = fgetln (f, &len);
        if (buf == NULL)
        {
            saved_errno = errno;
            if (feof (f))
                return ENOENT;
           return saved_errno;
        }
        if (line != NULL)
            (*line)++;
        while (len > 0 && (*buf == ' ' || *buf == '\t'))
        {
            buf++;
            len--;
        }
        if (len > 0 && buf[len - 1] == '\n')
            len--;
    }
    while (len == 0);

    *fields = NULL;
    *nfields = 0;

    off = 0;
    for (;;)
    {
        next = NULL;
        nextlen = 0;

        while (off != len && (buf[off] == ' ' || buf[off] == '\t'))
            off++;
        if (off == len)
        {
            sbfCsvParserAdd (fields, nfields, xstrdup (""));
            break;
        }

        quoted = buf[off] == '"';
        if (quoted)
            off++;

        comma = done = 0;
        while (off != len)
        {
            c = buf[off++];

            if (!quoted && c == separator)
            {
                while (nextlen > 0 && next[nextlen - 1] == ' ')
                    nextlen--;
                comma = 1;
                break;
            }
            if (quoted && c == '"')
            {
                if (off == len)
                    break;
                if (buf[off] != '"')
                {
                    while (off != len && (buf[off] == ' ' || buf[off] == '\t'))
                        off++;
                    if (off != len && buf[off++] != separator)
                        goto fail;
                    if (off != len)
                        comma = 1;
                    break;
                }
                else
                    off++;
            }

            sbfCsvParserExpand (&next, &nextlen, 1);
            next[nextlen - 1] = c;
        }

        sbfCsvParserExpand (&next, &nextlen, 1);
        next[nextlen - 1] = '\0';
        sbfCsvParserAdd (fields, nfields, next);

        if (!comma)
            break;
    }

    return 0;

fail:
    if (next != NULL)
        free (next);
    sbfCsvParser_free (*fields, *nfields);
    return EINVAL;
}